

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_text_want_type(archive_acl *acl,wchar_t flags)

{
  wchar_t local_20;
  wchar_t want_type;
  wchar_t flags_local;
  archive_acl *acl_local;
  
  if ((acl->acl_types & 0x3c00U) == 0) {
    local_20 = L'\0';
    if ((flags & 0x100U) != 0) {
      local_20 = L'Ā';
    }
    if ((flags & 0x200U) != 0) {
      local_20 = local_20 | 0x200;
    }
    if (local_20 == L'\0') {
      acl_local._4_4_ = L'̀';
    }
    else {
      acl_local._4_4_ = local_20;
    }
  }
  else if ((acl->acl_types & 0x300U) == 0) {
    acl_local._4_4_ = L'㰀';
  }
  else {
    acl_local._4_4_ = L'\0';
  }
  return acl_local._4_4_;
}

Assistant:

static int
archive_acl_text_want_type(struct archive_acl *acl, int flags)
{
	int want_type;

	/* Check if ACL is NFSv4 */
	if ((acl->acl_types & ARCHIVE_ENTRY_ACL_TYPE_NFS4) != 0) {
		/* NFSv4 should never mix with POSIX.1e */
		if ((acl->acl_types & ARCHIVE_ENTRY_ACL_TYPE_POSIX1E) != 0)
			return (0);
		else
			return (ARCHIVE_ENTRY_ACL_TYPE_NFS4);
	}

	/* Now deal with POSIX.1e ACLs */

	want_type = 0;
	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0)
		want_type |= ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0)
		want_type |= ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;

	/* By default we want both access and default ACLs */
	if (want_type == 0)
		return (ARCHIVE_ENTRY_ACL_TYPE_POSIX1E);

	return (want_type);
}